

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::genComputeGroupFiles(CppGenerator *this,size_t group)

{
  ostream *this_00;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ofstream ofs;
  size_t in_stack_00006780;
  CppGenerator *in_stack_00006788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b0;
  string local_640 [16];
  char *in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  CppGenerator *in_stack_fffffffffffff9e8;
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [48];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  ostream local_210 [512];
  long local_10;
  
  local_10 = in_RSI;
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::ofstream::ofstream(local_210,local_230,_S_out);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
  std::operator+((char *)in_RDI,in_stack_fffffffffffff9b0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::operator<<(local_210,local_2c0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_380);
  if ((*(byte *)(*(long *)(in_RDI + 9) + local_10) & 1) == 0) {
    offset_abi_cxx11_(in_stack_fffffffffffff9e8,(size_t)in_stack_fffffffffffff9e0);
    std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
    std::operator<<(local_210,local_460);
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string(local_4e0);
    std::__cxx11::string::~string(local_4a0);
    std::__cxx11::string::~string(local_4c0);
  }
  else {
    offset_abi_cxx11_(in_stack_fffffffffffff9e8,(size_t)in_stack_fffffffffffff9e0);
    std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
    std::operator<<(local_210,local_3c0);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::~string(local_420);
  }
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
  std::operator+((char *)in_RDI,in_stack_fffffffffffff9b0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::operator<<(local_210,local_500);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_540);
  std::ofstream::close();
  std::operator+(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::ofstream::open((string *)local_210,(_Ios_Openmode)local_560);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff9e8);
  std::operator+((char *)in_RDI,in_stack_fffffffffffff9b0);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffff9b0);
  std::operator<<(local_210,local_5e0);
  std::__cxx11::string::~string(local_5e0);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff9e0);
  if ((in_RDI[0x17]._M_string_length & 0x100) != 0) {
    std::operator<<(local_210,"#include \"DynamicFunctions.h\"\n");
  }
  std::operator<<(local_210,"namespace lmfao\n{\n");
  genComputeGroupFunction_abi_cxx11_(in_stack_00006788,in_stack_00006780);
  this_00 = std::operator<<(local_210,local_640);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_640);
  std::operator<<(local_210,"}\n");
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void CppGenerator::genComputeGroupFiles(size_t group)
{
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ComputeGroup"+std::to_string(group)+".h",
                      std::ofstream::out);

    ofs << "#ifndef INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_\n"+
        "#define INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_\n\n"+
        "#include \"DataHandler.h\"\n\nnamespace lmfao\n{\n";
    if (_parallelizeGroup[group])
    {
        // ofs << offset(1)+"void computeGroup"+std::to_string(group)+"(";

        // for (const size_t& viewID : viewGroups[group])
        // {
        //     ofs << "std::vector<"+viewName[viewID]+"_tuple>& "+viewName[viewID]+",";
        //     if (_requireHashing[viewID])
        //     {
        //         ofs << "std::unordered_map<"+viewName[viewID]+"_key,"+
        //             "size_t, "+viewName[viewID]+"_keyhash>& "+viewName[viewID]+"_map,";
        //     }
        // }
        // ofs << "size_t lowerptr, size_t upperptr);\n";
        // ofs << offset(1)+"void
        // computeGroup"+std::to_string(group)+"Parallelized();\n";
         ofs << offset(1)+"void computeGroup"+std::to_string(group)+"();\n";
    }
    else
    {
        ofs << offset(1)+"void computeGroup"+std::to_string(group)+"();\n"; 
    }
    
    ofs << "}\n\n#endif /* INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_*/\n";
    ofs.close();
        
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ComputeGroup"+std::to_string(group)+".cpp",
             std::ofstream::out);

    // TODO:TODO:TODO: We should avoid including DynamicFunctions.h if it is not
    // needed.
    
    ofs << "#include \"ComputeGroup"+std::to_string(group)+".h\"\n";

    if (_hasDynamicFunctions)
        ofs << "#include \"DynamicFunctions.h\"\n";
    
    ofs << "namespace lmfao\n{\n";
    ofs << genComputeGroupFunction(group) << std::endl;
    ofs << "}\n";
    ofs.close();
}